

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall
tcu::x11::glx::GlxContextFactory::GlxContextFactory(GlxContextFactory *this,EventState *eventState)

{
  PFNGLXCREATECONTEXTATTRIBSARBPROC p_Var1;
  TestError *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"glx",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"X11 GLX OpenGL Context",&local_5a);
  glu::ContextFactory::ContextFactory(&this->super_ContextFactory,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_ContextFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__GlxContextFactory_00bf2c30;
  p_Var1 = (PFNGLXCREATECONTEXTATTRIBSARBPROC)glXGetProcAddress("glXCreateContextAttribsARB");
  if (p_Var1 != (PFNGLXCREATECONTEXTATTRIBSARBPROC)0x0) {
    this->m_glXCreateContextAttribsARB = p_Var1;
    this->m_eventState = eventState;
    XSetErrorHandler(tcuX11GlxErrorHandler);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,"GLX call failed",
             "glXGetProcAddress( reinterpret_cast<const GLubyte*>(\"glXCreateContextAttribsARB\"))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0xcd);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

GlxContextFactory::GlxContextFactory (EventState& eventState)
	: glu::ContextFactory			("glx", "X11 GLX OpenGL Context")
	, m_glXCreateContextAttribsARB	(
		reinterpret_cast<PFNGLXCREATECONTEXTATTRIBSARBPROC>(
			TCU_CHECK_GLX(
				glXGetProcAddress(
					reinterpret_cast<const GLubyte*>("glXCreateContextAttribsARB")))))
	, m_eventState					(eventState)
{
	XSetErrorHandler(tcuX11GlxErrorHandler);
}